

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
::dx(FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fad<double> *pFVar8;
  FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
  *this_00;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar9;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar10;
  double *pdVar11;
  value_type vVar12;
  
  pFVar8 = this->left_;
  pdVar11 = &pFVar8->defaultVal;
  if ((pFVar8->dx_).num_elts != 0) {
    pdVar11 = (pFVar8->dx_).ptr_to_data + i;
  }
  iVar5 = (this->right_->fadexpr_).left_.constant_;
  this_00 = &((this->right_->fadexpr_).right_)->fadexpr_;
  dVar1 = this_00->left_->val_;
  pFVar9 = (this_00->right_->fadexpr_).left_;
  pFVar10 = (this_00->right_->fadexpr_).right_;
  iVar6 = (pFVar9->fadexpr_).left_.constant_;
  dVar2 = ((pFVar9->fadexpr_).right_)->val_;
  iVar7 = (pFVar10->fadexpr_).left_.constant_;
  dVar3 = ((pFVar10->fadexpr_).right_)->val_;
  dVar4 = *pdVar11;
  vVar12 = FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
           ::dx(this_00,i);
  return vVar12 * this->left_->val_ +
         (dVar1 / (((double)iVar7 + dVar3) * ((double)iVar6 + dVar2)) + (double)iVar5) * dVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}